

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

ly_bool lyd_meta_is_internal(lyd_meta *meta)

{
  char *__s1;
  int iVar1;
  char *arg;
  lyd_meta *meta_local;
  
  if (meta->annotation == (lysc_ext_instance *)0x0) {
    __assert_fail("meta->annotation",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x47f,"ly_bool lyd_meta_is_internal(const struct lyd_meta *)");
  }
  __s1 = meta->annotation->argument;
  iVar1 = strcmp(meta->annotation->module->name,"yang");
  if ((iVar1 == 0) && (iVar1 = strcmp(__s1,"lyds_tree"), iVar1 == 0)) {
    return '\x01';
  }
  return '\0';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_meta_is_internal(const struct lyd_meta *meta)
{
    const char *arg;

    assert(meta->annotation);

    arg = meta->annotation->argument;
    if (!strcmp(meta->annotation->module->name, "yang") && !strcmp(arg, "lyds_tree")) {
        return 1;
    }

    return 0;
}